

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tensor.h
# Opt level: O0

void __thiscall
dlib::resizable_tensor::resizable_tensor(resizable_tensor *this,resizable_tensor *item)

{
  size_t __n;
  long *in_RSI;
  tensor *in_RDI;
  any *in_stack_ffffffffffffffb8;
  gpu_data *in_stack_ffffffffffffffc0;
  longlong *this_00;
  tensor *item_00;
  resizable_tensor *in_stack_ffffffffffffffe0;
  
  tensor::tensor(in_RDI);
  in_RDI->_vptr_tensor = (_func_int **)&PTR__resizable_tensor_0038ced8;
  item_00 = in_RDI + 1;
  gpu_data::gpu_data(in_stack_ffffffffffffffc0);
  this_00 = &in_RDI[2].m_nr;
  (**(code **)(*in_RSI + 0x40))();
  any::any((any *)this_00,in_stack_ffffffffffffffb8);
  copy_size(in_stack_ffffffffffffffe0,item_00);
  memcpy(in_RDI,in_RSI,__n);
  return;
}

Assistant:

resizable_tensor(const resizable_tensor& item) : _annotation(item.annotation()) 
        {
            copy_size(item);
            memcpy(*this, item);
        }